

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O2

CHAR_DATA * get_rand_from_room(ROOM_INDEX_DATA *room)

{
  CHAR_DATA *pCVar1;
  int iVar2;
  CHAR_DATA **ppCVar3;
  int iVar4;
  CHAR_DATA *pCVar5;
  
  pCVar5 = (CHAR_DATA *)0x0;
  iVar4 = 0;
  ppCVar3 = &room->people;
  while (pCVar1 = *ppCVar3, pCVar1 != (CHAR_DATA *)0x0) {
    iVar2 = number_percent();
    if (iVar4 < iVar2) {
      iVar4 = iVar2;
      pCVar5 = pCVar1;
    }
    ppCVar3 = &pCVar1->next_in_room;
  }
  return pCVar5;
}

Assistant:

CHAR_DATA *get_rand_from_room(ROOM_INDEX_DATA *room)
{
	CHAR_DATA *vch, *victim = nullptr;
	int now = 0, highest = 0;

	for (vch = room->people; vch; vch = vch->next_in_room)
	{
		if ((now = number_percent()) > highest)
		{
			victim = vch;
			highest = now;
		}
	}

	return victim;
}